

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DefaultIOStream.cpp
# Opt level: O2

aiReturn __thiscall
Assimp::DefaultIOStream::Seek(DefaultIOStream *this,size_t pOffset,aiOrigin pOrigin)

{
  int iVar1;
  
  if ((FILE *)this->mFile != (FILE *)0x0) {
    iVar1 = fseek((FILE *)this->mFile,pOffset,pOrigin);
    return -(uint)(iVar1 != 0);
  }
  return aiReturn_FAILURE;
}

Assistant:

aiReturn DefaultIOStream::Seek(size_t pOffset,
     aiOrigin pOrigin)
{
    if (!mFile) {
        return AI_FAILURE;
    }

    // Just to check whether our enum maps one to one with the CRT constants
    static_assert(aiOrigin_CUR == SEEK_CUR &&
        aiOrigin_END == SEEK_END && aiOrigin_SET == SEEK_SET, "aiOrigin_CUR == SEEK_CUR && \
        aiOrigin_END == SEEK_END && aiOrigin_SET == SEEK_SET");

    // do the seek
    return (0 == ::fseek(mFile, (long)pOffset,(int)pOrigin) ? AI_SUCCESS : AI_FAILURE);
}